

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  xml_node_struct *pxVar1;
  byte bVar2;
  char cVar3;
  code *pcVar4;
  code *pcVar5;
  xml_node_struct *pxVar6;
  uintptr_t *puVar7;
  xml_document_struct *pxVar8;
  bool bVar9;
  byte bVar10;
  xml_encoding xVar11;
  value_type vVar12;
  char_t *pcVar13;
  value_type puVar14;
  value_type puVar15;
  xml_node_struct *pxVar16;
  xml_node_struct *node;
  xml_attribute_struct *pxVar17;
  char_t *pcVar18;
  xml_node_struct *pxVar19;
  xml_node_struct **ppxVar20;
  byte bVar21;
  byte bVar22;
  ushort uVar23;
  ushort *puVar24;
  char *pcVar25;
  long lVar26;
  byte *pbVar27;
  long lVar28;
  byte *pbVar29;
  uint uVar30;
  size_t sVar31;
  ulong uVar32;
  xml_parse_status xVar33;
  ulong uVar34;
  ushort *puVar35;
  ushort uVar36;
  long lVar37;
  long lVar38;
  size_t sVar39;
  xml_node_struct *pxVar40;
  size_t sVar41;
  xml_parse_result *pxVar42;
  xml_node_struct *pxVar43;
  long lStack_f0;
  xml_node_struct *local_c0;
  xml_document_struct *local_b8;
  size_t length;
  char_t *buffer;
  xml_node_struct *local_a0;
  ulong local_98;
  xml_node_struct *local_90;
  xml_parse_result *local_88;
  uint local_7c;
  xml_parse_result result;
  xml_node_struct *local_58;
  
  if (size != 0 && contents == (void *)0x0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    goto LAB_0019d4cb;
  }
  xVar11 = get_buffer_encoding(encoding,contents,size);
  buffer = (char_t *)0x0;
  length = 0;
  local_b8 = doc;
  local_90 = root;
  local_88 = __return_storage_ptr__;
  if (xVar11 == encoding_utf8) {
LAB_0019d49a:
    bVar9 = get_mutable_buffer(&buffer,&length,contents,size,is_mutable);
    if (bVar9) goto LAB_0019d9c6;
  }
  else if ((xVar11 & ~encoding_utf8) == encoding_utf16_le) {
    uVar32 = size >> 1;
    if (xVar11 == encoding_utf16_le) {
      lVar28 = 0;
      lVar26 = -1;
      puVar35 = (ushort *)contents;
      for (uVar34 = uVar32; uVar34 != 0; uVar34 = uVar34 + lVar38) {
        uVar23 = *puVar35;
        lVar38 = lVar26;
        if (uVar23 < 0xd800) {
          lVar37 = 3 - (ulong)(uVar23 < 0x800);
          if (uVar23 < 0x80) {
            lVar37 = 1;
          }
          lVar28 = lVar28 + lVar37;
LAB_0019d54b:
          puVar24 = puVar35 + 1;
        }
        else {
          if ((~uVar23 & 0xe000) == 0) {
            lVar28 = lVar28 + 3;
            goto LAB_0019d54b;
          }
          puVar24 = puVar35 + 1;
          if (((uVar34 != 1) && ((uVar23 & 0xfc00) == 0xd800)) && ((*puVar24 & 0xfc00) == 0xdc00)) {
            lVar28 = lVar28 + 4;
            puVar24 = puVar35 + 2;
            lVar38 = -2;
          }
        }
        puVar35 = puVar24;
      }
      sVar39 = lVar28 + 1;
      puVar14 = (value_type)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(sVar39);
      if (puVar14 != (value_type)0x0) {
        lVar26 = -1;
        puVar15 = puVar14;
        puVar35 = (ushort *)contents;
        for (; uVar32 != 0; uVar32 = uVar32 + lStack_f0) {
          uVar23 = *puVar35;
          uVar30 = (uint)uVar23;
          lStack_f0 = lVar26;
          if ((uVar23 < 0xd800) || ((~uVar23 & 0xe000) == 0)) {
            puVar15 = utf8_writer::low(puVar15,uVar30);
            puVar24 = puVar35 + 1;
          }
          else {
            puVar24 = puVar35 + 1;
            if (((uVar32 != 1) && ((uVar30 & 0xfc00) == 0xd800)) && ((*puVar24 & 0xfc00) == 0xdc00))
            {
              puVar15 = utf8_writer::high(puVar15,(uVar30 & 0x3ff) * 0x400 + (*puVar24 & 0x3ff) +
                                                  0x10000);
              puVar24 = puVar35 + 2;
              lStack_f0 = -2;
            }
          }
          puVar35 = puVar24;
        }
        if (puVar15 != puVar14 + lVar28) {
          pcVar25 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
LAB_0019ead3:
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                        ,0x88e,pcVar25);
        }
LAB_0019d9b9:
        *puVar15 = '\0';
        length = sVar39;
        buffer = (char_t *)puVar14;
LAB_0019d9c6:
        pxVar6 = local_90;
        pcVar13 = buffer;
        pxVar8 = local_b8;
        if (own) {
          if (contents != (void *)0x0 && buffer != (char_t *)contents) {
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )();
          }
LAB_0019da15:
          *out_buffer = pcVar13;
        }
        else if (buffer != (char_t *)contents) goto LAB_0019da15;
        pxVar42 = local_88;
        sVar39 = length;
        pxVar8->buffer = pcVar13;
        if (length != 0) {
          if (pxVar6->first_child == (xml_node_struct *)0x0) {
            local_58 = (xml_node_struct *)0x0;
          }
          else {
            local_58 = pxVar6->first_child->prev_sibling_c;
          }
          bVar2 = pcVar13[length - 1];
          pcVar13[length - 1] = '\0';
          pxVar40 = (xml_node_struct *)pcVar13;
          if ((*pcVar13 == -0x11) && (pcVar13[1] == -0x45)) {
            pxVar40 = (xml_node_struct *)(pcVar13 + (ulong)(pcVar13[2] == -0x41) * 3);
          }
          local_b8 = (xml_document_struct *)&pxVar8->super_xml_allocator;
          local_98 = length - 1;
          pcVar4 = *(code **)((long)&PTR_parse_simple_0024e558 + (ulong)(options >> 1 & 0x78));
          pcVar5 = (code *)(&PTR_parse_0024e5d8)[options >> 9 & 4 | options >> 4 & 3];
          local_7c = options & 0x22;
          bVar10 = bVar2 ^ 0x3e;
          node = pxVar6;
LAB_0019db46:
          do {
            bVar21 = (byte)pxVar40->header;
            while( true ) {
              pxVar16 = pxVar40;
              if (bVar21 == 0) goto LAB_0019e78a;
              if (bVar21 == 0x3c) goto LAB_0019dbd6;
              lVar26 = 0;
              while (((anonymous_namespace)::chartype_table[bVar21] & 8) != 0) {
                bVar21 = *(byte *)((long)&pxVar16->header + lVar26 + 1);
                lVar26 = lVar26 + 1;
              }
              if ((bVar21 != 0x3c) && (bVar21 != 0)) break;
              if (lVar26 == 0) {
                __assert_fail("mark != s",
                              "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                              ,0xd63,
                              "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                             );
              }
              pxVar40 = (xml_node_struct *)((long)&pxVar16->header + lVar26);
              if (((options >> 0xb & 1) == 0 && (options & 0x408) != 0) &&
                 (((options >> 10 & 1) == 0 ||
                  (((bVar21 == 0x3c && (*(byte *)((long)&pxVar16->header + lVar26 + 1) == 0x2f)) &&
                   (node->first_child == (xml_node_struct *)0x0)))))) break;
            }
            if ((options >> 0xb & 1) != 0) {
              pxVar16 = (xml_node_struct *)((long)&pxVar16->header + lVar26);
            }
            if (((options >> 0xc & 1) != 0) || (node->parent != (xml_node_struct *)0x0)) {
              if ((((options >> 0xd & 1) == 0) ||
                  ((node->parent == (xml_node_struct *)0x0 ||
                   (node->first_child != (xml_node_struct *)0x0)))) ||
                 (node->value != (char_t *)0x0)) {
                pxVar40 = append_new_node(node,(xml_allocator *)local_b8,node_pcdata);
                if (pxVar40 != (xml_node_struct *)0x0) {
                  pxVar40->value = (char_t *)pxVar16;
                  node = pxVar40->parent;
                  goto LAB_0019dc1d;
                }
                goto LAB_0019e7d7;
              }
              node->value = (char_t *)pxVar16;
LAB_0019dc1d:
              pxVar16 = (xml_node_struct *)(*pcVar5)(pxVar16);
              bVar21 = (byte)pxVar16->header;
              if (bVar21 != 0) goto LAB_0019dc39;
LAB_0019e78a:
              pxVar19 = (xml_node_struct *)0x0;
              if (node != local_90) {
                pxVar19 = pxVar16;
              }
              xVar33 = status_end_element_mismatch;
              if (node == local_90) {
                xVar33 = status_ok;
              }
              goto LAB_0019e8e3;
            }
            while( true ) {
              bVar21 = (byte)pxVar16->header;
              if (bVar21 == 0) goto LAB_0019e78a;
              if (bVar21 == 0x3c) break;
              pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
            }
LAB_0019dbd6:
            bVar21 = *(byte *)((long)&pxVar16->header + 1);
            pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
LAB_0019dc39:
            if (-1 < (char)(anonymous_namespace)::chartype_table[bVar21]) {
              if (bVar21 == 0x21) {
                bVar21 = *(byte *)((long)&pxVar16->header + 1);
                if (bVar21 == 0x5b) {
                  if (*(byte *)((long)&pxVar16->header + 2) == 0x43) {
                    if (*(byte *)((long)&pxVar16->header + 3) == 0x44) {
                      if (*(byte *)((long)&pxVar16->header + 4) == 0x41) {
                        if (*(byte *)((long)&pxVar16->header + 5) == 0x54) {
                          if (*(byte *)((long)&pxVar16->header + 6) == 0x41) {
                            if (*(byte *)((long)&pxVar16->header + 7) == 0x5b) {
                              pxVar16 = (xml_node_struct *)&pxVar16->name;
                              pxVar19 = pxVar16;
                              if ((options & 4) == 0) {
                                do {
                                  bVar21 = (byte)pxVar19->header;
                                  if (bVar21 == 0x5d) {
                                    if (*(byte *)((long)&pxVar19->header + 1) == 0x5d) {
                                      bVar21 = *(byte *)((long)&pxVar19->header + 2);
                                      if ((bVar21 == 0x3e) || (bVar10 == 0 && bVar21 == 0))
                                      goto LAB_0019e6f8;
                                    }
                                  }
                                  else if (bVar21 == 0) goto LAB_0019e8cf;
                                  pxVar19 = (xml_node_struct *)((long)&pxVar19->header + 1);
                                } while( true );
                              }
                              pxVar40 = append_new_node(node,(xml_allocator *)local_b8,node_cdata);
                              if (pxVar40 != (xml_node_struct *)0x0) {
                                pxVar40->value = (char_t *)pxVar16;
                                if ((options & 0x20) != 0) {
                                  result.status = status_ok;
                                  result._4_4_ = 0;
                                  result.offset = 0;
LAB_0019e43b:
                                  do {
                                    while (bVar21 = (byte)pxVar16->header,
                                          ((anonymous_namespace)::chartype_table[bVar21] & 0x10) ==
                                          0) {
                                      bVar21 = *(byte *)((long)&pxVar16->header + 1);
                                      if (((anonymous_namespace)::chartype_table[bVar21] & 0x10) !=
                                          0) {
                                        pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
                                        break;
                                      }
                                      bVar21 = *(byte *)((long)&pxVar16->header + 2);
                                      if (((anonymous_namespace)::chartype_table[bVar21] & 0x10) !=
                                          0) {
                                        pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 2);
                                        break;
                                      }
                                      bVar21 = *(byte *)((long)&pxVar16->header + 3);
                                      if (((anonymous_namespace)::chartype_table[bVar21] & 0x10) !=
                                          0) {
                                        pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 3);
                                        break;
                                      }
                                      pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 4);
                                    }
                                    if (bVar21 == 0xd) {
                                      local_c0 = (xml_node_struct *)((long)&pxVar16->header + 1);
                                      *(byte *)&pxVar16->header = 10;
                                      puVar7 = &pxVar16->header;
                                      pxVar16 = local_c0;
                                      if (*(byte *)((long)puVar7 + 1) == 10) {
                                        gap::push((gap *)&result,(char_t **)&local_c0,1);
                                        pxVar16 = local_c0;
                                      }
                                      goto LAB_0019e43b;
                                    }
                                    local_c0 = pxVar16;
                                    if (bVar21 == 0x5d) {
                                      if ((*(byte *)((long)&pxVar16->header + 1) == 0x5d) &&
                                         ((bVar21 = *(byte *)((long)&pxVar16->header + 2),
                                          bVar21 == 0x3e || (bVar10 == 0 && bVar21 == 0))))
                                      goto LAB_0019e6dc;
                                    }
                                    else if (bVar21 == 0) {
                                      pxVar19 = (xml_node_struct *)pxVar40->value;
                                      goto LAB_0019e8cf;
                                    }
                                    pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
                                  } while( true );
                                }
                                do {
                                  bVar21 = (byte)pxVar19->header;
                                  if (bVar21 == 0x5d) {
                                    if (*(byte *)((long)&pxVar19->header + 1) == 0x5d) {
                                      bVar21 = *(byte *)((long)&pxVar19->header + 2);
                                      if ((bVar21 == 0x3e) || (bVar10 == 0 && bVar21 == 0))
                                      goto LAB_0019e6cf;
                                    }
                                  }
                                  else if (bVar21 == 0) goto LAB_0019e8cf;
                                  pxVar19 = (xml_node_struct *)((long)&pxVar19->header + 1);
                                } while( true );
                              }
                              goto LAB_0019e7d7;
                            }
                            pxVar19 = (xml_node_struct *)((long)&pxVar16->header + 7);
                          }
                          else {
                            pxVar19 = (xml_node_struct *)((long)&pxVar16->header + 6);
                          }
                        }
                        else {
                          pxVar19 = (xml_node_struct *)((long)&pxVar16->header + 5);
                        }
                      }
                      else {
                        pxVar19 = (xml_node_struct *)((long)&pxVar16->header + 4);
                      }
                    }
                    else {
                      pxVar19 = (xml_node_struct *)((long)&pxVar16->header + 3);
                    }
                  }
                  else {
                    pxVar19 = (xml_node_struct *)((long)&pxVar16->header + 2);
                  }
LAB_0019e8cf:
                  xVar33 = status_bad_cdata;
                }
                else {
                  pxVar19 = (xml_node_struct *)((long)&pxVar16->header + 1);
                  if (bVar21 == 0x44) {
                    if ((((*(byte *)((long)&pxVar16->header + 2) == 0x4f) &&
                         (*(byte *)((long)&pxVar16->header + 3) == 0x43)) &&
                        (*(byte *)((long)&pxVar16->header + 4) == 0x54)) &&
                       ((*(byte *)((long)&pxVar16->header + 5) == 0x59 &&
                        (*(byte *)((long)&pxVar16->header + 6) == 0x50)))) {
                      bVar21 = *(byte *)((long)&pxVar16->header + 7);
                      if ((bVar21 != 0x45) && (bVar2 != 0x45 || bVar21 != 0)) goto LAB_0019e810;
                      pxVar40 = (xml_node_struct *)((long)&pxVar16[-1].first_attribute + 7);
                      if (node->parent == (xml_node_struct *)0x0) {
                        bVar21 = (byte)pxVar40->header;
                        if ((bVar21 != 0x3c) && (bVar21 != 0)) {
                          __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                                        ,0xbb5,
                                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                                       );
                        }
                        bVar21 = 0x44;
                        lVar26 = 0;
                        pxVar40 = pxVar19;
LAB_0019e0e6:
                        if ((bVar21 == 0x22) || (bVar21 == 0x27)) {
                          pxVar19 = (xml_node_struct *)((long)&pxVar40->header + 1);
                          do {
                            pxVar40 = pxVar19;
                            bVar22 = (byte)pxVar40->header;
                            pxVar19 = (xml_node_struct *)((long)&pxVar40->header + 1);
                            if (bVar22 == 0) break;
                          } while (bVar22 != bVar21);
                          if (bVar22 == 0) goto LAB_0019e8d6;
                        }
                        else {
                          if (bVar21 == 0x3c) {
                            bVar21 = *(byte *)((long)&pxVar40->header + 1);
                            if (bVar21 == 0x3f) {
                              pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 2);
                              do {
                                bVar21 = (byte)pxVar40->header;
                                if (bVar21 == 0x3f) {
                                  if (*(byte *)((long)&pxVar40->header + 1) == 0x3e)
                                  goto LAB_0019e1e3;
                                }
                                else if (bVar21 == 0) goto LAB_0019e8d6;
                                pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 1);
                              } while( true );
                            }
                            if (bVar21 == 0x21) {
                              bVar21 = *(byte *)((long)&pxVar40->header + 2);
                              if (bVar21 != 0x2d) {
                                if (bVar21 == 0x5b) {
                                  pxVar19 = (xml_node_struct *)((long)&pxVar40->header + 3);
                                  lVar28 = 0;
LAB_0019e168:
                                  pxVar19 = (xml_node_struct *)((long)&pxVar19->header + 3);
                                  do {
                                    cVar3 = *(char *)((long)&pxVar19[-1].first_attribute + 5);
                                    if (cVar3 == '<') {
                                      if ((*(char *)((long)&pxVar19[-1].first_attribute + 6) == '!')
                                         && (*(char *)((long)&pxVar19[-1].first_attribute + 7) ==
                                             '[')) {
                                        lVar28 = lVar28 + 1;
                                        goto LAB_0019e168;
                                      }
                                    }
                                    else if (cVar3 == ']') {
                                      if ((*(char *)((long)&pxVar19[-1].first_attribute + 6) == ']')
                                         && (*(char *)((long)&pxVar19[-1].first_attribute + 7) ==
                                             '>')) goto LAB_0019e1ac;
                                    }
                                    else if (cVar3 == '\0') {
                                      pxVar40 = (xml_node_struct *)
                                                ((long)&pxVar19[-1].first_attribute + 5);
                                      goto LAB_0019e8d6;
                                    }
                                    pxVar19 = (xml_node_struct *)((long)&pxVar19->header + 1);
                                  } while( true );
                                }
                                pxVar19 = (xml_node_struct *)((long)&pxVar40->header + 2);
                                lVar26 = lVar26 + 1;
                                goto LAB_0019e130;
                              }
                              if (*(byte *)((long)&pxVar40->header + 3) == 0x2d) {
                                pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 4);
                                do {
                                  bVar21 = (byte)pxVar40->header;
                                  if (bVar21 == 0x2d) {
                                    if ((*(byte *)((long)&pxVar40->header + 1) == 0x2d) &&
                                       (*(byte *)((long)&pxVar40->header + 2) == 0x3e))
                                    goto LAB_0019e230;
                                  }
                                  else if (bVar21 == 0) break;
                                  pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 1);
                                } while( true );
                              }
                            }
                            goto LAB_0019e8d6;
                          }
                          if (bVar21 == 0x3e) {
                            if (lVar26 == 0) goto LAB_0019e725;
                            lVar26 = lVar26 + -1;
                          }
                          else if (bVar21 == 0) goto LAB_0019e711;
                          pxVar19 = (xml_node_struct *)((long)&pxVar40->header + 1);
                        }
                        goto LAB_0019e130;
                      }
                      goto LAB_0019e8d6;
                    }
LAB_0019e810:
                    xVar33 = status_unrecognized_tag;
                  }
                  else if (bVar21 == 0x2d) {
                    if (*(byte *)((long)&pxVar16->header + 2) == 0x2d) {
                      pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 3);
                      local_a0 = node;
                      if ((options & 2) == 0) {
LAB_0019de4f:
                        if (local_7c != 0x22) {
                          do {
                            bVar21 = (byte)pxVar16->header;
                            if (bVar21 == 0x2d) {
                              if (*(byte *)((long)&pxVar16->header + 1) == 0x2d) {
                                bVar21 = *(byte *)((long)&pxVar16->header + 2);
                                if ((bVar21 == 0x3e) || (bVar10 == 0 && bVar21 == 0))
                                goto LAB_0019e649;
                              }
                            }
                            else if (bVar21 == 0) goto LAB_0019e8ac;
                            pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
                          } while( true );
                        }
                        result.status = status_ok;
                        result._4_4_ = 0;
                        result.offset = 0;
LAB_0019de62:
                        do {
                          while (bVar21 = (byte)pxVar16->header,
                                ((anonymous_namespace)::chartype_table[bVar21] & 0x20) == 0) {
                            bVar21 = *(byte *)((long)&pxVar16->header + 1);
                            if (((anonymous_namespace)::chartype_table[bVar21] & 0x20) != 0) {
                              pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
                              break;
                            }
                            bVar21 = *(byte *)((long)&pxVar16->header + 2);
                            if (((anonymous_namespace)::chartype_table[bVar21] & 0x20) != 0) {
                              pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 2);
                              break;
                            }
                            bVar21 = *(byte *)((long)&pxVar16->header + 3);
                            if (((anonymous_namespace)::chartype_table[bVar21] & 0x20) != 0) {
                              pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 3);
                              break;
                            }
                            pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 4);
                          }
                          if (bVar21 == 0xd) {
                            local_c0 = (xml_node_struct *)((long)&pxVar16->header + 1);
                            *(byte *)&pxVar16->header = 10;
                            puVar7 = &pxVar16->header;
                            pxVar16 = local_c0;
                            if (*(byte *)((long)puVar7 + 1) == 10) {
                              gap::push((gap *)&result,(char_t **)&local_c0,1);
                              pxVar16 = local_c0;
                            }
                            goto LAB_0019de62;
                          }
                          local_c0 = pxVar16;
                          if (bVar21 == 0x2d) {
                            if ((*(byte *)((long)&pxVar16->header + 1) == 0x2d) &&
                               ((bVar21 = *(byte *)((long)&pxVar16->header + 2), bVar21 == 0x3e ||
                                (bVar10 == 0 && bVar21 == 0)))) goto LAB_0019e667;
                          }
                          else if (bVar21 == 0) {
                            pxVar16 = (xml_node_struct *)node->value;
                            goto LAB_0019e8ac;
                          }
                          pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
                        } while( true );
                      }
                      node = append_new_node(node,(xml_allocator *)local_b8,node_comment);
                      if (node != (xml_node_struct *)0x0) {
                        node->value = (char_t *)pxVar16;
                        goto LAB_0019de4f;
                      }
                      goto LAB_0019e7d7;
                    }
                    pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 2);
LAB_0019e8ac:
                    xVar33 = status_bad_comment;
                    pxVar19 = pxVar16;
                  }
                  else if ((bVar2 == 0x2d) && (bVar21 == 0)) {
                    xVar33 = status_bad_comment;
                  }
                  else {
                    xVar33 = (uint)(bVar2 == 0x5b && bVar21 == 0) * 3 + status_unrecognized_tag;
                  }
                }
              }
              else if (bVar21 == 0x3f) {
                pxVar1 = (xml_node_struct *)((long)&pxVar16->header + 1);
                bVar21 = *(byte *)((long)&pxVar16->header + 1);
                pxVar19 = pxVar1;
                if ((char)(anonymous_namespace)::chartype_table[bVar21] < '\0') {
                  lVar26 = 4;
                  pbVar29 = (byte *)((long)&pxVar16->header + 3);
                  lVar28 = 1;
                  pxVar43 = (xml_node_struct *)((long)&pxVar16->header + 1);
                  do {
                    pxVar40 = pxVar43;
                    lVar38 = lVar28;
                    pbVar27 = pbVar29;
                    bVar22 = (byte)pxVar40->header;
                    uVar32 = (ulong)bVar22;
                    pxVar43 = (xml_node_struct *)((long)&pxVar40->header + 1);
                    lVar26 = lVar26 + -1;
                    pbVar29 = pbVar27 + 1;
                    lVar28 = lVar38 + 1;
                  } while (((anonymous_namespace)::chartype_table[uVar32] & 0x40) != 0);
                  pxVar19 = pxVar40;
                  if (bVar22 == 0) goto LAB_0019e7ea;
                  pxVar19 = (xml_node_struct *)((long)&pxVar16->header + lVar38);
                  if (((bVar21 & 0xdf) == 0x58) && ((pxVar16->header & 0xdf0000) == 0x4d0000)) {
                    bVar9 = (pxVar16->header & 0xdf000000) != 0x4c000000;
                    uVar30 = 1;
                    if (lVar26 == 0 && !bVar9) {
                      uVar30 = 0x100;
                    }
                    if ((options & uVar30) == 0) {
LAB_0019df2b:
                      do {
                        if ((char)uVar32 == '?') {
                          bVar21 = *(byte *)((long)&pxVar40->header + 1);
                          if ((bVar21 == 0x3e) || (bVar10 == 0 && bVar21 == 0)) goto LAB_0019e348;
                        }
                        else {
                          pxVar19 = pxVar40;
                          if ((int)uVar32 == 0) goto LAB_0019e7ea;
                          bVar21 = *(byte *)((long)&pxVar40->header + 1);
                        }
                        uVar32 = (ulong)bVar21;
                        pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 1);
                      } while( true );
                    }
                    if (lVar26 != 0 || bVar9) goto LAB_0019dffa;
                    local_a0 = pxVar1;
                    if (node->parent != (xml_node_struct *)0x0) goto LAB_0019e7ea;
                    node = append_new_node(node,(xml_allocator *)local_b8,node_declaration);
                    pxVar16 = pxVar19;
                    if (node == (xml_node_struct *)0x0) goto LAB_0019e7d7;
                    bVar9 = true;
                  }
                  else {
                    if ((options & 1) == 0) goto LAB_0019df2b;
LAB_0019dffa:
                    local_a0 = pxVar1;
                    node = append_new_node(node,(xml_allocator *)local_b8,node_pi);
                    pxVar16 = pxVar19;
                    if (node == (xml_node_struct *)0x0) goto LAB_0019e7d7;
                    bVar9 = false;
                  }
                  node->name = (char_t *)local_a0;
                  uVar32 = (ulong)(byte)pxVar40->header;
                  *(byte *)&pxVar40->header = 0;
                  if (uVar32 != 0x3f) {
                    pxVar19 = pxVar43;
                    if (((anonymous_namespace)::chartype_table[uVar32] & 8) != 0) {
                      do {
                        pbVar29 = pbVar27;
                        uVar32 = (ulong)*(byte *)((long)&pxVar40->header + 1);
                        pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 1);
                        pbVar27 = pbVar29 + 1;
                      } while (((anonymous_namespace)::chartype_table[uVar32] & 8) != 0);
                      do {
                        if ((char)uVar32 == '?') {
                          bVar21 = *pbVar29;
                          if ((bVar21 == 0x3e) || (bVar10 == 0 && bVar21 == 0)) goto LAB_0019e415;
                        }
                        else {
                          if ((int)uVar32 == 0) {
                            pxVar19 = (xml_node_struct *)(pbVar29 + -1);
                            break;
                          }
                          bVar21 = *pbVar29;
                        }
                        uVar32 = (ulong)bVar21;
                        pbVar29 = pbVar29 + 1;
                      } while( true );
                    }
                    goto LAB_0019e7ea;
                  }
                  bVar21 = (byte)pxVar43->header;
                  if ((bVar21 != 0x3e) && (bVar10 != 0 || bVar21 != 0)) {
                    pxVar19 = (xml_node_struct *)((long)&pxVar19->header + 1);
                    goto LAB_0019e7ea;
                  }
                  pxVar40 = (xml_node_struct *)((long)&pxVar43->header + (ulong)(bVar21 == 0x3e));
                  node = node->parent;
                  goto LAB_0019e50d;
                }
LAB_0019e7ea:
                xVar33 = status_bad_pi;
              }
              else if (bVar21 == 0x2f) {
                pxVar40 = (xml_node_struct *)((long)&pxVar16->header + 1);
                pbVar29 = (byte *)node->name;
                pxVar16 = pxVar40;
                if (pbVar29 == (byte *)0x0) {
LAB_0019e7ca:
                  xVar33 = status_end_element_mismatch;
                  pxVar19 = pxVar40;
                }
                else {
                  while (bVar21 = (byte)pxVar16->header,
                        ((anonymous_namespace)::chartype_table[bVar21] & 0x40) != 0) {
                    bVar22 = *pbVar29;
                    pbVar29 = pbVar29 + 1;
                    pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
                    if (bVar21 != bVar22) goto LAB_0019e7ca;
                  }
                  if (*pbVar29 == 0) goto code_r0x0019df69;
                  xVar33 = status_bad_end_element;
                  if (((bVar21 != 0) || (*pbVar29 != bVar2)) || (pxVar19 = pxVar16, pbVar29[1] != 0)
                     ) {
                    xVar33 = status_end_element_mismatch;
                    pxVar19 = pxVar40;
                  }
                }
              }
              else {
                xVar33 = (bVar2 == 0x3f && bVar21 == 0) + status_unrecognized_tag;
                pxVar19 = pxVar16;
              }
              goto LAB_0019e8e3;
            }
            node = append_new_node(node,(xml_allocator *)local_b8,node_element);
            if (node == (xml_node_struct *)0x0) goto LAB_0019e7d7;
            node->name = (char_t *)pxVar16;
            pxVar40 = (xml_node_struct *)((long)&pxVar16->header + 1);
            do {
              pxVar16 = pxVar40;
              uVar32 = (ulong)*(byte *)((long)&pxVar16[-1].first_attribute + 7);
              bVar21 = (anonymous_namespace)::chartype_table[uVar32];
              if ((bVar21 & 0x40) == 0) {
                pxVar16 = (xml_node_struct *)((long)&pxVar16[-1].first_attribute + 7);
                goto LAB_0019dfa0;
              }
              uVar32 = (ulong)(byte)pxVar16->header;
              bVar21 = (anonymous_namespace)::chartype_table[uVar32];
              if ((bVar21 & 0x40) == 0) goto LAB_0019dfa0;
              uVar32 = (ulong)*(byte *)((long)&pxVar16->header + 1);
              bVar21 = (anonymous_namespace)::chartype_table[uVar32];
              if ((bVar21 & 0x40) == 0) {
                pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
                goto LAB_0019dfa0;
              }
              uVar32 = (ulong)*(byte *)((long)&pxVar16->header + 2);
              bVar21 = (anonymous_namespace)::chartype_table[uVar32];
              pxVar40 = (xml_node_struct *)((long)&pxVar16->header + 4);
            } while ((bVar21 & 0x40) != 0);
            pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 2);
LAB_0019dfa0:
            *(byte *)&pxVar16->header = 0;
            pxVar40 = (xml_node_struct *)((long)&pxVar16->header + 1);
          } while ((char)uVar32 == '>');
          if ((bVar21 & 8) != 0) goto LAB_0019e525;
          if ((char)uVar32 == '\0') {
            pxVar40 = pxVar16;
            if (bVar2 == 0x3e) goto LAB_0019db46;
          }
          else {
            pxVar16 = pxVar40;
            if ((int)uVar32 == 0x2f) {
              bVar21 = (byte)pxVar40->header;
              if ((bVar21 != 0x3e) && (bVar10 != 0 || bVar21 != 0)) goto LAB_0019e9ee;
              node = node->parent;
              pxVar40 = (xml_node_struct *)((long)&pxVar40->header + (ulong)(bVar21 == 0x3e));
              goto LAB_0019db46;
            }
          }
          goto LAB_0019e9ee;
        }
        xml_parse_result::xml_parse_result(local_88);
        pxVar42->status = ~options >> 8 & status_no_document_element;
        pxVar42->offset = 0;
        goto LAB_0019e9d2;
      }
    }
    else {
      lVar26 = -1;
      lVar28 = 0;
      puVar35 = (ushort *)contents;
      for (uVar34 = uVar32; uVar34 != 0; uVar34 = uVar34 + lVar38) {
        uVar23 = *puVar35 << 8;
        uVar36 = uVar23 | *puVar35 >> 8;
        lVar38 = lVar26;
        if (uVar36 < 0xd800) {
          lVar37 = 3 - (ulong)(uVar36 < 0x800);
          if (uVar36 < 0x80) {
            lVar37 = 1;
          }
          lVar28 = lVar28 + lVar37;
LAB_0019d665:
          puVar24 = puVar35 + 1;
        }
        else {
          if ((~uVar36 & 0xe000) == 0) {
            lVar28 = lVar28 + 3;
            goto LAB_0019d665;
          }
          puVar24 = puVar35 + 1;
          if (((uVar34 != 1) && ((uVar23 & 0xfc00) == 0xd800)) && ((*puVar24 & 0xfc) == 0xdc)) {
            lVar28 = lVar28 + 4;
            puVar24 = puVar35 + 2;
            lVar38 = -2;
          }
        }
        puVar35 = puVar24;
      }
      puVar14 = (value_type)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(lVar28 + 1U);
      if (puVar14 != (value_type)0x0) {
        lVar26 = -1;
        puVar15 = puVar14;
        puVar35 = (ushort *)contents;
        for (; uVar32 != 0; uVar32 = uVar32 + lStack_f0) {
          uVar23 = *puVar35 << 8 | *puVar35 >> 8;
          uVar30 = (uint)uVar23;
          lStack_f0 = lVar26;
          if ((uVar23 < 0xd800) || ((~uVar30 & 0xe000) == 0)) {
            puVar15 = utf8_writer::low(puVar15,uVar30);
            puVar24 = puVar35 + 1;
          }
          else {
            puVar24 = puVar35 + 1;
            if (((uVar32 != 1) && ((uVar30 & 0xfc00) == 0xd800)) &&
               (uVar30 = (uint)(ushort)(*puVar24 << 8 | *puVar24 >> 8), (uVar30 & 0xfc00) == 0xdc00)
               ) {
              puVar15 = utf8_writer::high(puVar15,(uVar23 & 0x3ff) * 0x400 + (uVar30 & 0x3ff) +
                                                  0x10000);
              puVar24 = puVar35 + 2;
              lStack_f0 = -2;
            }
          }
          puVar35 = puVar24;
        }
        if (puVar15 != puVar14 + lVar28) {
          pcVar25 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_0019ead3;
        }
        *puVar15 = '\0';
        length = lVar28 + 1U;
        buffer = (char_t *)puVar14;
        goto LAB_0019d9c6;
      }
    }
  }
  else {
    if (1 < xVar11 - encoding_utf32_le) {
      if (xVar11 != encoding_latin1) {
        __assert_fail("false && \"Invalid encoding\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0x8e3,
                      "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                     );
      }
      lVar26 = 0;
      pcVar25 = (char *)contents;
LAB_0019d77a:
      if (size + lVar26 != 0) {
        if (-1 < *pcVar25) goto code_r0x0019d78f;
        lVar28 = 0;
        sVar39 = -lVar26;
        for (sVar31 = sVar39; size != sVar31; sVar31 = sVar31 + 1) {
          lVar28 = (lVar28 - (ulong)(-1 < *(char *)((long)contents + sVar31))) + 2;
        }
        sVar41 = (lVar28 - lVar26) + 1;
        pcVar13 = (char_t *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(sVar41);
        if (pcVar13 != (char_t *)0x0) {
          memcpy(pcVar13,contents,sVar39);
          puVar14 = (value_type)(pcVar13 + -lVar26);
          for (; size != sVar39; sVar39 = sVar39 + 1) {
            puVar14 = utf8_writer::low(puVar14,(uint)*(byte *)((long)contents + sVar39));
          }
          if ((value_type)(pcVar13 + (lVar28 - lVar26)) != puVar14) {
            __assert_fail("oend == obegin + length",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                          ,0x8bc,
                          "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                         );
          }
          *puVar14 = '\0';
          length = sVar41;
          buffer = pcVar13;
          goto LAB_0019d9c6;
        }
        goto LAB_0019d4b7;
      }
      goto LAB_0019d49a;
    }
    uVar32 = size >> 2;
    if (xVar11 == encoding_utf32_le) {
      vVar12 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
               process<pugi::impl::(anonymous_namespace)::utf8_counter>(contents,uVar32);
      pcVar13 = (char_t *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(vVar12 + 1);
      if (pcVar13 != (char_t *)0x0) {
        puVar14 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
                  process<pugi::impl::(anonymous_namespace)::utf8_writer>(contents,uVar32,pcVar13);
        if (puVar14 != (value_type)(pcVar13 + vVar12)) {
          pcVar25 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
          goto LAB_0019ead3;
        }
        *puVar14 = '\0';
        length = vVar12 + 1;
        buffer = pcVar13;
        goto LAB_0019d9c6;
      }
    }
    else {
      lVar26 = 0;
      for (uVar34 = 0; uVar32 != uVar34; uVar34 = uVar34 + 1) {
        uVar30 = *(uint *)((long)contents + uVar34 * 4);
        uVar30 = uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 | uVar30 << 0x18
        ;
        if (uVar30 < 0x10000) {
          lVar28 = 3 - (ulong)(uVar30 < 0x800);
          if (uVar30 < 0x80) {
            lVar28 = 1;
          }
          lVar26 = lVar26 + lVar28;
        }
        else {
          lVar26 = lVar26 + 4;
        }
      }
      sVar39 = lVar26 + 1;
      puVar14 = (value_type)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(sVar39);
      if (puVar14 != (value_type)0x0) {
        puVar15 = puVar14;
        for (uVar34 = 0; uVar32 != uVar34; uVar34 = uVar34 + 1) {
          uVar30 = *(uint *)((long)contents + uVar34 * 4);
          uVar30 = uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 |
                   uVar30 << 0x18;
          if (uVar30 < 0x10000) {
            puVar15 = utf8_writer::low(puVar15,uVar30);
          }
          else {
            puVar15 = utf8_writer::high(puVar15,uVar30);
          }
        }
        if (puVar15 != puVar14 + lVar26) {
          pcVar25 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_0019ead3;
        }
        goto LAB_0019d9b9;
      }
    }
  }
LAB_0019d4b7:
  __return_storage_ptr__ = local_88;
  xml_parse_result::xml_parse_result(local_88);
  __return_storage_ptr__->status = status_out_of_memory;
LAB_0019d4cb:
  __return_storage_ptr__->offset = 0;
  return __return_storage_ptr__;
code_r0x0019d78f:
  lVar26 = lVar26 + -1;
  pcVar25 = pcVar25 + 1;
  goto LAB_0019d77a;
LAB_0019e6dc:
  pcVar18 = gap::flush((gap *)&result,(char_t *)pxVar16);
  *pcVar18 = '\0';
  pxVar19 = pxVar16;
  goto LAB_0019e6f8;
LAB_0019e6cf:
  *(byte *)&pxVar19->header = 0;
LAB_0019e6f8:
  pxVar40 = (xml_node_struct *)
            ((long)&pxVar19->header + (ulong)(*(byte *)((long)&pxVar19->header + 2) == 0x3e) + 2);
  goto LAB_0019db46;
LAB_0019e711:
  if ((bVar2 != 0x3e) || (lVar26 != 0)) {
LAB_0019e8d6:
    xVar33 = status_bad_doctype;
    pxVar19 = pxVar40;
    goto LAB_0019e8e3;
  }
LAB_0019e725:
  if ((bVar21 != 0x3e) && (bVar10 != 0 || bVar21 != 0)) {
    __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0xc39,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  if (bVar21 != 0) {
    *(byte *)&pxVar40->header = 0;
    pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 1);
  }
  if ((options >> 9 & 1) != 0) {
    pbVar29 = (byte *)((long)&pxVar16->header + 7);
    do {
      pbVar27 = pbVar29 + 1;
      pbVar29 = pbVar29 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbVar27] & 8) != 0);
    pxVar19 = append_new_node(node,(xml_allocator *)local_b8,node_doctype);
    pxVar16 = pxVar40;
    if (pxVar19 == (xml_node_struct *)0x0) {
LAB_0019e7d7:
      xVar33 = status_out_of_memory;
      pxVar19 = pxVar16;
      goto LAB_0019e8e3;
    }
    pxVar19->value = (char_t *)pbVar29;
  }
  goto LAB_0019db46;
LAB_0019e1e3:
  pxVar19 = (xml_node_struct *)((long)&pxVar40->header + 2);
  goto LAB_0019e130;
LAB_0019e230:
  pxVar19 = (xml_node_struct *)((long)&pxVar40->header + 3);
LAB_0019e130:
  bVar21 = (byte)pxVar19->header;
  pxVar40 = pxVar19;
  goto LAB_0019e0e6;
LAB_0019e1ac:
  if (lVar28 != 0) {
    lVar28 = lVar28 + -1;
    goto LAB_0019e168;
  }
  goto LAB_0019e130;
LAB_0019e649:
  if ((options & 2) != 0) {
    *(byte *)&pxVar16->header = 0;
  }
  pxVar40 = (xml_node_struct *)((long)&pxVar16->header + (ulong)(bVar21 == 0x3e) + 2);
  node = local_a0;
  goto LAB_0019db46;
LAB_0019e667:
  pcVar18 = gap::flush((gap *)&result,(char_t *)pxVar16);
  *pcVar18 = '\0';
  pxVar40 = (xml_node_struct *)
            ((long)&pxVar16->header + (ulong)(*(byte *)((long)&pxVar16->header + 2) == 0x3e) + 2);
  node = local_a0;
  goto LAB_0019db46;
LAB_0019e348:
  pxVar40 = (xml_node_struct *)((long)&pxVar40->header + (ulong)(bVar21 == 0x3e) + 1);
LAB_0019e50d:
  if (node == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0xd4f,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  goto LAB_0019e516;
LAB_0019e415:
  if (!bVar9) {
    node->value = (char_t *)pxVar40;
    node = node->parent;
    pbVar29[-1] = 0;
    pxVar40 = (xml_node_struct *)(pbVar29 + (*pbVar29 == 0x3e));
    goto LAB_0019e50d;
  }
  pbVar29[-1] = 0x2f;
LAB_0019e516:
  if ((node->header & 0xf) != 7) goto LAB_0019db46;
LAB_0019e525:
  while( true ) {
    do {
      pxVar16 = pxVar40;
      bVar21 = (byte)pxVar16->header;
      pxVar40 = (xml_node_struct *)((long)&pxVar16->header + 1);
    } while (((anonymous_namespace)::chartype_table[bVar21] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar21]) break;
    pxVar17 = append_new_attribute(node,(xml_allocator *)local_b8);
    if (pxVar17 == (xml_attribute_struct *)0x0) goto LAB_0019e7d7;
    pxVar17->name = (char_t *)pxVar16;
    pxVar16 = (xml_node_struct *)((long)&pxVar16->header + 1);
    do {
      pxVar40 = pxVar16;
      bVar21 = *(byte *)((long)&pxVar40[-1].first_attribute + 7);
      bVar22 = (anonymous_namespace)::chartype_table[bVar21];
      if ((bVar22 & 0x40) == 0) {
        pxVar40 = (xml_node_struct *)((long)&pxVar40[-1].first_attribute + 7);
        goto LAB_0019e5a9;
      }
      bVar21 = (byte)pxVar40->header;
      bVar22 = (anonymous_namespace)::chartype_table[bVar21];
      if ((bVar22 & 0x40) == 0) goto LAB_0019e5a9;
      bVar21 = *(byte *)((long)&pxVar40->header + 1);
      bVar22 = (anonymous_namespace)::chartype_table[bVar21];
      if ((bVar22 & 0x40) == 0) {
        pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 1);
        goto LAB_0019e5a9;
      }
      bVar21 = *(byte *)((long)&pxVar40->header + 2);
      bVar22 = (anonymous_namespace)::chartype_table[bVar21];
      pxVar16 = (xml_node_struct *)((long)&pxVar40->header + 4);
    } while ((bVar22 & 0x40) != 0);
    pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 2);
LAB_0019e5a9:
    *(byte *)&pxVar40->header = 0;
    while (pxVar40 = (xml_node_struct *)((long)&pxVar40->header + 1), (bVar22 & 8) != 0) {
      bVar21 = (byte)pxVar40->header;
      bVar22 = (anonymous_namespace)::chartype_table[bVar21];
    }
    pxVar16 = pxVar40;
    if (bVar21 != 0x3d) goto LAB_0019e800;
    do {
      pxVar40 = pxVar16;
      bVar21 = (byte)pxVar40->header;
      pxVar16 = (xml_node_struct *)((long)&pxVar40->header + 1);
    } while (((anonymous_namespace)::chartype_table[bVar21] & 8) != 0);
    if ((bVar21 != 0x22) && (bVar21 != 0x27)) goto LAB_0019e800;
    pxVar17->value = (char_t *)pxVar16;
    pxVar40 = (xml_node_struct *)(*pcVar4)(pxVar16,(int)(char)bVar21);
    if (pxVar40 == (xml_node_struct *)0x0) {
      pxVar40 = (xml_node_struct *)pxVar17->value;
      goto LAB_0019e800;
    }
    if ((char)(anonymous_namespace)::chartype_table[(byte)pxVar40->header] < '\0') {
LAB_0019e800:
      xVar33 = status_bad_attribute;
      pxVar19 = pxVar40;
      goto LAB_0019e8e3;
    }
  }
  if (bVar21 == 0x3e) goto LAB_0019db46;
  if (bVar21 == 0x2f) {
    bVar21 = (byte)pxVar40->header;
    if (bVar21 == 0x3e) {
      pxVar40 = (xml_node_struct *)((long)&pxVar16->header + 2);
      node = node->parent;
      goto LAB_0019db46;
    }
    pxVar16 = pxVar40;
    if ((bVar2 == 0x3e) && (bVar21 == 0)) {
      node = node->parent;
      goto LAB_0019db46;
    }
  }
  else if ((bVar2 == 0x3e) && (pxVar40 = pxVar16, bVar21 == 0)) goto LAB_0019db46;
LAB_0019e9ee:
  xVar33 = status_bad_start_element;
  pxVar19 = pxVar16;
  goto LAB_0019e8e3;
code_r0x0019df69:
  do {
    pxVar19 = pxVar16;
    bVar21 = (byte)pxVar19->header;
    pxVar16 = (xml_node_struct *)((long)&pxVar19->header + 1);
  } while (((anonymous_namespace)::chartype_table[bVar21] & 8) != 0);
  pxVar40 = pxVar19;
  bVar22 = bVar2;
  if (bVar21 != 0) {
    pxVar40 = pxVar16;
    bVar22 = bVar21;
  }
  node = node->parent;
  if (bVar22 != 0x3e) goto LAB_0019ea08;
  goto LAB_0019db46;
LAB_0019ea08:
  xVar33 = status_bad_end_element;
LAB_0019e8e3:
  uVar32 = (long)pxVar19 - (long)pcVar13;
  if (pxVar19 == (xml_node_struct *)0x0) {
    uVar32 = 0;
  }
  xml_parse_result::xml_parse_result(&result);
  pxVar42 = local_88;
  result.status = xVar33;
  result.offset = uVar32;
  if (((long)uVar32 < 0) || (sVar39 < uVar32)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                  ,0xdc8,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  if (xVar33 == status_ok) {
    if (bVar2 != 0x3c) {
      if ((options >> 0xc & 1) == 0) {
        ppxVar20 = &local_58->next_sibling;
        if (local_58 == (xml_node_struct *)0x0) {
          ppxVar20 = &pxVar6->first_child;
        }
        do {
          pxVar6 = *ppxVar20;
          if (pxVar6 == (xml_node_struct *)0x0) {
            xml_parse_result::xml_parse_result(local_88);
            pxVar42->status = status_no_document_element;
            result.offset = local_98;
            goto LAB_0019e9ce;
          }
          ppxVar20 = &pxVar6->next_sibling;
        } while ((pxVar6->header & 0xf) != 2);
      }
      goto LAB_0019e999;
    }
    xml_parse_result::xml_parse_result(local_88);
    pxVar42->status = status_unrecognized_tag;
    result.offset = local_98;
  }
  else {
    if (((uVar32 != 0) && (uVar32 == local_98)) && (bVar2 == 0)) {
      result.offset = sVar39 - 2;
    }
LAB_0019e999:
    local_88->encoding = result.encoding;
    *(undefined4 *)&local_88->field_0x14 = result._20_4_;
    local_88->status = xVar33;
    *(undefined4 *)&local_88->field_0x4 = result._4_4_;
  }
LAB_0019e9ce:
  pxVar42->offset = result.offset;
LAB_0019e9d2:
  pxVar42->encoding = xVar11;
  return pxVar42;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}